

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blitter.cpp
# Opt level: O3

void __thiscall E64::blitter_ic::io_write_8(blitter_ic *this,uint16_t address,uint8_t byte)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  ushort uVar4;
  
  switch((char)address) {
  case '\x02':
    if ((byte & 1) != 0) {
      uVar1 = this->head;
      this->operations[uVar1].type = CLEAR;
      this->head = uVar1 + 1;
    }
    if ((byte & 2) != 0) {
      uVar1 = this->head;
      this->operations[uVar1].type = HOR_BORDER;
      this->head = uVar1 + 1;
    }
    if ((byte & 4) != 0) {
      uVar1 = this->head;
      this->operations[uVar1].type = VER_BORDER;
      this->head = uVar1 + 1;
      return;
    }
    break;
  case '\x03':
    this->blitter_context_ptr_no = byte;
    return;
  case '\t':
    uVar1 = this->scanlines >> 1;
    if (byte <= uVar1) {
      uVar1 = (ushort)byte;
    }
    this->hor_border_size = uVar1;
    return;
  case '\n':
    uVar1 = (ushort)(byte)this->ver_border_size;
    uVar4 = (ushort)byte << 8;
    goto LAB_001153ab;
  case '\v':
    uVar1 = (ushort)*(byte *)((long)&this->ver_border_size + 1) << 8;
    uVar4 = (ushort)byte;
LAB_001153ab:
    uVar2 = this->pixels_per_scanline >> 1;
    if ((uVar4 | uVar1) < uVar2) {
      uVar2 = uVar4 | uVar1;
    }
    this->ver_border_size = uVar2;
    return;
  case '\f':
    *(uint8_t *)((long)&this->hor_border_color + 1) = byte;
    return;
  case '\r':
    *(uint8_t *)&this->hor_border_color = byte;
    return;
  case '\x0e':
    *(uint8_t *)((long)&this->ver_border_color + 1) = byte;
    return;
  case '\x0f':
    *(uint8_t *)&this->ver_border_color = byte;
    return;
  case '\x10':
    *(uint8_t *)((long)&this->clear_color + 1) = byte;
    return;
  case '\x11':
    *(uint8_t *)&this->clear_color = byte;
    return;
  case '\x12':
    uVar1 = this->pixels_per_scanline >> 3;
    uVar3 = (uint)uVar1;
    if (byte < uVar1) {
      uVar3 = (uint)byte;
    }
    uVar3 = uVar3 + ((char)uVar3 == '\0');
    this->current_blitter_width = (uint8_t)uVar3;
    (this->screen_size).w = (uVar3 & 0xff) << 3;
    return;
  case '\x13':
    uVar1 = this->scanlines >> 3;
    uVar3 = (uint)uVar1;
    if (byte < uVar1) {
      uVar3 = (uint)byte;
    }
    uVar3 = uVar3 + ((char)uVar3 == '\0');
    this->current_blitter_height = (uint8_t)uVar3;
    uVar3 = uVar3 & 0xff;
    (this->screen_size).h = uVar3 * 8;
    (this->scanline_screen_size).h = uVar3 << 5;
  }
  return;
}

Assistant:

void E64::blitter_ic::io_write_8(uint16_t address, uint8_t byte)
{
	
	switch (address & 0xff) {
		case BLITTER_SR:
//			if ((byte & 0b00000001) && pending_screenrefresh_irq) {
//				pending_screenrefresh_irq = false;
//				if (exceptions_connected) {
//					TTL74LS148->release_line(interrupt_device_no);
//				}
//			}
			break;
		case BLITTER_CR:
//			if (byte & 0b00000001) {
//				generate_screenrefresh_irq = true;
//			} else {
//				generate_screenrefresh_irq = false;
//			}
			break;
		case BLITTER_OPERATION:
			if (byte & 0b00000001) add_operation_clear_framebuffer();
			if (byte & 0b00000010) add_operation_draw_hor_border();
			if (byte & 0b00000100) add_operation_draw_ver_border();
			break;
		case BLITTER_CONTEXT_PTR_NO:
			blitter_context_ptr_no = byte;
			break;
		case BLITTER_HOR_BORDER_SIZE+1:
			hor_border_size = byte;
			if (hor_border_size > (scanlines / 2)) {
				hor_border_size = (scanlines / 2);
			}
			break;
		case BLITTER_VER_BORDER_SIZE:
			ver_border_size = (ver_border_size & 0x00ff) | (byte << 8);
			if (ver_border_size > (pixels_per_scanline / 2)) {
				ver_border_size = (pixels_per_scanline / 2);
			}
			break;
		case BLITTER_VER_BORDER_SIZE+1:
			ver_border_size = (ver_border_size & 0xff00) | byte;
			if (ver_border_size > (pixels_per_scanline / 2)) {
				ver_border_size = (pixels_per_scanline / 2);
			}
			break;
		case BLITTER_HOR_BORDER_COLOR:
			hor_border_color = (hor_border_color & 0x00ff) | (byte << 8);
			break;
		case BLITTER_HOR_BORDER_COLOR+1:
			hor_border_color = (hor_border_color & 0xff00) | byte;
			break;
		case BLITTER_VER_BORDER_COLOR:
			ver_border_color = (ver_border_color & 0x00ff) | (byte << 8);
			break;
		case BLITTER_VER_BORDER_COLOR+1:
			ver_border_color = (ver_border_color & 0xff00) | byte;
			break;
		case BLITTER_CLEAR_COLOR:
			clear_color = (clear_color & 0x00ff) | (byte << 8);
			break;
		case BLITTER_CLEAR_COLOR+1:
			clear_color = (clear_color & 0xff00) | byte;
			break;
		case BLITTER_SCREEN_WIDTH:
			set_current_blitter_width(byte);
			break;
		case BLITTER_SCREEN_HEIGHT:
			set_current_blitter_height(byte);
			break;
		default:
			break;
	}
}